

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::noteLocalType(BinaryInstWriter *this,Type type,Index count)

{
  mapped_type *pmVar1;
  mapped_type *num;
  Index count_local;
  BinaryInstWriter *this_local;
  Type type_local;
  
  this_local = (BinaryInstWriter *)type.id;
  pmVar1 = std::
           unordered_map<wasm::Type,_unsigned_long,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>_>
           ::operator[](&this->numLocalsByType,(key_type *)&this_local);
  if (*pmVar1 == 0) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              (&this->localTypes,(value_type *)&this_local);
  }
  *pmVar1 = (ulong)count + *pmVar1;
  return;
}

Assistant:

void BinaryInstWriter::noteLocalType(Type type, Index count) {
  auto& num = numLocalsByType[type];
  if (num == 0) {
    localTypes.push_back(type);
  }
  num += count;
}